

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O1

bool __thiscall QCborArray::contains(QCborArray *this,QCborValue *value)

{
  QCborContainerPrivate *this_00;
  ulong uVar1;
  int iVar2;
  ulong idx;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    idx = uVar1;
    this_00 = (this->d).d.ptr;
    if (this_00 == (QCborContainerPrivate *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (this_00->elements).d.size;
    }
    if (uVar3 <= idx) break;
    iVar2 = QCborContainerPrivate::compareElement(this_00,idx,value,ForEquality);
    uVar1 = idx + 1;
  } while (iVar2 != 0);
  return idx < uVar3;
}

Assistant:

bool QCborArray::contains(const QCborValue &value) const
{
    for (qsizetype i = 0; i < size(); ++i) {
        int cmp = d->compareElement(i, value, Comparison::ForEquality);
        if (cmp == 0)
            return true;
    }
    return false;
}